

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int putVarint64(uchar *p,u64 v)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  u8 buf [10];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (v >> 0x38 == 0) {
    uVar3 = 0;
    do {
      uVar5 = uVar3;
      buf[uVar5] = (byte)v | 0x80;
      uVar3 = uVar5 + 1;
      bVar2 = 0x7f < v;
      v = v >> 7;
    } while (bVar2);
    buf[0] = buf[0] & 0x7f;
    uVar6 = uVar3;
    for (; uVar5 != 0xffffffffffffffff; uVar5 = uVar5 - 1) {
      uVar6 = uVar6 - 1;
      *p = buf[uVar6 & 0xffffffff];
      p = p + 1;
    }
  }
  else {
    p[8] = (uchar)v;
    uVar5 = v >> 8;
    uVar3 = 9;
    for (uVar4 = 7; -1 < (int)uVar4; uVar4 = uVar4 - 1) {
      p[uVar4] = (byte)uVar5 | 0x80;
      uVar5 = uVar5 >> 7;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)uVar3;
  }
  __stack_chk_fail();
}

Assistant:

static int SQLITE_NOINLINE putVarint64(unsigned char *p, u64 v){
  int i, j, n;
  u8 buf[10];
  if( v & (((u64)0xff000000)<<32) ){
    p[8] = (u8)v;
    v >>= 8;
    for(i=7; i>=0; i--){
      p[i] = (u8)((v & 0x7f) | 0x80);
      v >>= 7;
    }
    return 9;
  }    
  n = 0;
  do{
    buf[n++] = (u8)((v & 0x7f) | 0x80);
    v >>= 7;
  }while( v!=0 );
  buf[0] &= 0x7f;
  assert( n<=9 );
  for(i=0, j=n-1; j>=0; j--, i++){
    p[i] = buf[j];
  }
  return n;
}